

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

void __thiscall
rsg::AssignStatement::tokenize(AssignStatement *this,GeneratorState *state,TokenStream *str)

{
  pointer pTVar1;
  size_t sVar2;
  size_t sVar3;
  Token local_40;
  Token local_30;
  
  Token::Token(&local_30,(this->m_variable->m_name)._M_dataplus._M_p);
  pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar1 >> 4;
  sVar3 = str->m_numTokens;
  if (sVar2 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x40);
    pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = str->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,&local_30);
  sVar2 = str->m_numTokens;
  sVar3 = sVar2 + 1;
  str->m_numTokens = sVar3;
  local_40.m_type = EQUAL;
  pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar1 >> 4 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x41);
    pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = str->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,&local_40);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_40);
  Token::~Token(&local_30);
  (*this->m_valueExpr->_vptr_Expression[3])(this->m_valueExpr,state,str);
  local_30.m_type = SEMICOLON;
  pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar1 >> 4;
  sVar3 = str->m_numTokens;
  if (sVar2 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x40);
    pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = str->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,&local_30);
  sVar2 = str->m_numTokens;
  sVar3 = sVar2 + 1;
  str->m_numTokens = sVar3;
  local_40.m_type = NEWLINE;
  pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar1 >> 4 == sVar3) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x41);
    pTVar1 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = str->m_numTokens;
  }
  Token::operator=(pTVar1 + sVar3,&local_40);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_40);
  Token::~Token(&local_30);
  return;
}

Assistant:

void AssignStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token(m_variable->getName()) << Token::EQUAL;
	m_valueExpr->tokenize(state, str);
	str << Token::SEMICOLON << Token::NEWLINE;
}